

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O1

bool __thiscall
google::protobuf::DescriptorBuilder::OptionInterpreter::InterpretSingleOption
          (OptionInterpreter *this,Message *options,vector<int,_std::allocator<int>_> *src_path,
          vector<int,_std::allocator<int>_> *options_path,bool skip_extensions)

{
  FieldDescriptor **ppFVar1;
  uint8_t uVar2;
  string *psVar3;
  void *pvVar4;
  DescriptorBuilder *pDVar5;
  FunctionRef<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_()>
  make_error;
  FunctionRef<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_()>
  make_error_00;
  FunctionRef<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_()>
  make_error_01;
  FunctionRef<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_()>
  make_error_02;
  FunctionRef<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_()>
  make_error_03;
  FunctionRef<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_()>
  make_error_04;
  FunctionRef<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_()>
  make_error_05;
  bool bVar6;
  FieldDescriptor *pFVar7;
  const_iterator intermediate_fields_iter;
  size_t __ptr;
  bool bVar8;
  undefined1 uVar9;
  bool bVar10;
  bool bVar11;
  undefined1 extraout_AL;
  int iVar12;
  int iVar13;
  Value<google::protobuf::internal::GenericTypeHandler<google::protobuf::UninterpretedOption_NamePart>_>
  *pVVar14;
  Symbol SVar15;
  Symbol SVar16;
  UnknownFieldSet *pUVar17;
  undefined8 uVar18;
  string *psVar19;
  byte bVar20;
  UninterpretedOption *descriptor_00;
  pointer pcVar21;
  size_type sVar22;
  DescriptorBuilder *pDVar23;
  long *plVar24;
  iterator iVar25;
  string_view name;
  string_view name_00;
  string_view name_01;
  string_view element_name;
  string_view element_name_00;
  string_view element_name_01;
  string_view element_name_02;
  string_view element_name_03;
  string_view element_name_04;
  string_view element_name_05;
  Metadata MVar26;
  string_view relative_to;
  unique_ptr<google::protobuf::UnknownFieldSet,_std::default_delete<google::protobuf::UnknownFieldSet>_>
  parent_unknown_fields;
  FieldDescriptor *field;
  string outstr;
  vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
  intermediate_fields;
  vector<int,_std::allocator<int>_> dest_path;
  Descriptor *descriptor;
  string debug_msg_name;
  unique_ptr<google::protobuf::UnknownFieldSet,_std::default_delete<google::protobuf::UnknownFieldSet>_>
  unknown_fields;
  FileDescriptor *local_140;
  FieldDescriptor *local_138;
  undefined1 local_130 [56];
  const_iterator local_f8;
  iterator iStack_f0;
  undefined1 local_e8 [8];
  vector<int,_std::allocator<int>_> local_e0;
  DescriptorBuilder *local_c8;
  string local_c0;
  HeapOrSoo local_a0 [3];
  AlphaNum local_70;
  vector<int,_std::allocator<int>_> *local_40;
  Type local_34;
  
  descriptor_00 = this->uninterpreted_option_;
  local_130._48_8_ = options;
  if ((descriptor_00->field_0)._impl_.name_.super_RepeatedPtrFieldBase.current_size_ == 0) {
    if (skip_extensions) {
      return true;
    }
    pDVar23 = this->builder_;
    pcVar21 = (this->options_to_interpret_->element_name)._M_dataplus._M_p;
    sVar22 = (this->options_to_interpret_->element_name)._M_string_length;
    local_130._8_8_ =
         absl::lts_20240722::functional_internal::
         InvokeObject<google::protobuf::DescriptorBuilder::OptionInterpreter::InterpretSingleOption(google::protobuf::Message*,std::vector<int,std::allocator<int>>const&,std::vector<int,std::allocator<int>>const&,bool)::__0,std::__cxx11::string>
    ;
LAB_001f7ebb:
    local_130._0_8_ = local_a0;
    make_error_05.invoker_._0_4_ = (int)local_130._8_8_;
    make_error_05.ptr_.obj = (void *)local_130._0_8_;
    make_error_05.invoker_._4_4_ = 0;
    element_name_05._M_str = pcVar21;
    element_name_05._M_len = sVar22;
    AddError(pDVar23,element_name_05,&descriptor_00->super_Message,OPTION_NAME,make_error_05);
    return false;
  }
  pVVar14 = internal::RepeatedPtrFieldBase::
            Get<google::protobuf::internal::GenericTypeHandler<google::protobuf::UninterpretedOption_NamePart>>
                      (&(descriptor_00->field_0)._impl_.name_.super_RepeatedPtrFieldBase,0);
  iVar12 = std::__cxx11::string::compare
                     ((char *)((ulong)(pVVar14->field_0)._impl_.name_part_.tagged_ptr_.ptr_ &
                              0xfffffffffffffffc));
  if (iVar12 == 0) {
    if (skip_extensions) {
      return true;
    }
    pDVar23 = this->builder_;
    pcVar21 = (this->options_to_interpret_->element_name)._M_dataplus._M_p;
    sVar22 = (this->options_to_interpret_->element_name)._M_string_length;
    descriptor_00 = this->uninterpreted_option_;
    local_130._8_8_ =
         absl::lts_20240722::functional_internal::
         InvokeObject<google::protobuf::DescriptorBuilder::OptionInterpreter::InterpretSingleOption(google::protobuf::Message*,std::vector<int,std::allocator<int>>const&,std::vector<int,std::allocator<int>>const&,bool)::__1,std::__cxx11::string>
    ;
    goto LAB_001f7ebb;
  }
  local_40 = src_path;
  pVVar14 = internal::RepeatedPtrFieldBase::
            Get<google::protobuf::internal::GenericTypeHandler<google::protobuf::UninterpretedOption_NamePart>>
                      (&(this->uninterpreted_option_->field_0)._impl_.name_.
                        super_RepeatedPtrFieldBase,0);
  bVar10 = true;
  if ((pVVar14->field_0)._impl_.is_extension_ == skip_extensions) {
    return true;
  }
  pDVar23 = this->builder_;
  MVar26 = Message::GetMetadata((Message *)local_130._48_8_);
  psVar3 = (MVar26.descriptor)->all_names_;
  name._M_str = psVar3[1]._M_dataplus._M_p;
  name._M_len = psVar3[1]._M_string_length;
  SVar15 = FindSymbolNotEnforcingDeps(pDVar23,name,true);
  SVar16.ptr_ = (SymbolBase *)(DescriptorBuilder *)0x0;
  if ((SVar15.ptr_)->symbol_type_ == '\x01') {
    SVar16 = SVar15;
  }
  if ((DescriptorBuilder *)SVar16.ptr_ == (DescriptorBuilder *)0x0) {
    MVar26 = Message::GetMetadata((Message *)local_130._48_8_);
    SVar16.ptr_ = &(MVar26.descriptor)->super_SymbolBase;
  }
  bVar20 = (byte)SVar15.ptr_;
  if ((DescriptorBuilder *)SVar16.ptr_ == (DescriptorBuilder *)0x0) {
    InterpretSingleOption((OptionInterpreter *)local_130);
    uVar9 = extraout_AL;
LAB_001f8288:
    psVar19 = absl::lts_20240722::log_internal::MakeCheckOpString<bool,bool>
                        ((bool)uVar9,0xbf < bVar20,"is_repeated_ == label() == LABEL_REPEATED");
  }
  else {
    local_138 = (FieldDescriptor *)0x0;
    local_e8 = (undefined1  [8])0x0;
    local_f8._M_current = (FieldDescriptor **)0x0;
    iStack_f0._M_current = (FieldDescriptor **)0x0;
    local_c0._M_dataplus._M_p = (pointer)&local_c0.field_2;
    local_c0._M_string_length = 0;
    local_c0.field_2._M_local_buf[0] = '\0';
    local_c8 = (DescriptorBuilder *)SVar16.ptr_;
    std::vector<int,_std::allocator<int>_>::vector(&local_e0,options_path);
    iVar12 = *(int *)((long)&this->uninterpreted_option_->field_0 + 0x10);
    bVar11 = 0 < iVar12;
    if (0 < iVar12) {
      iVar12 = 0;
      bVar11 = true;
      do {
        pDVar23 = this->builder_;
        (pDVar23->undefine_resolved_name_)._M_string_length = 0;
        *(pDVar23->undefine_resolved_name_)._M_dataplus._M_p = '\0';
        pVVar14 = internal::RepeatedPtrFieldBase::
                  Get<google::protobuf::internal::GenericTypeHandler<google::protobuf::UninterpretedOption_NamePart>>
                            (&(this->uninterpreted_option_->field_0)._impl_.name_.
                              super_RepeatedPtrFieldBase,iVar12);
        pvVar4 = (pVVar14->field_0)._impl_.name_part_.tagged_ptr_.ptr_;
        if (local_c0._M_string_length != 0) {
          local_130._0_8_ = (HeapOrSoo *)0x1;
          local_130._8_8_ = ".";
          absl::lts_20240722::StrAppend((string *)&local_c0,(AlphaNum *)local_130);
        }
        pVVar14 = internal::RepeatedPtrFieldBase::
                  Get<google::protobuf::internal::GenericTypeHandler<google::protobuf::UninterpretedOption_NamePart>>
                            (&(this->uninterpreted_option_->field_0)._impl_.name_.
                              super_RepeatedPtrFieldBase,iVar12);
        plVar24 = (long *)((ulong)pvVar4 & 0xfffffffffffffffc);
        if ((pVVar14->field_0)._impl_.is_extension_ == true) {
          local_130._0_8_ = (HeapOrSoo *)0x1;
          local_130._8_8_ = "(";
          local_a0[0]._8_8_ = *plVar24;
          local_a0[0]._0_8_ = plVar24[1];
          local_70.piece_._M_len = 1;
          local_70.piece_._M_str = ")";
          absl::lts_20240722::StrAppend
                    ((string *)&local_c0,(AlphaNum *)local_130,(AlphaNum *)&local_a0[0].heap,
                     &local_70);
          pDVar23 = this->builder_;
          name_00._M_str = (char *)*plVar24;
          name_00._M_len = plVar24[1];
          relative_to._M_str = (this->options_to_interpret_->name_scope)._M_dataplus._M_p;
          relative_to._M_len = (this->options_to_interpret_->name_scope)._M_string_length;
          local_138 = (FieldDescriptor *)
                      LookupSymbol(pDVar23,name_00,relative_to,PLACEHOLDER_MESSAGE,LOOKUP_ALL,true);
          if (((SymbolBase *)local_138)->symbol_type_ != '\x02') {
            local_138 = (FieldDescriptor *)0x0;
          }
        }
        else {
          local_130._8_8_ = *plVar24;
          local_130._0_8_ = plVar24[1];
          absl::lts_20240722::StrAppend((string *)&local_c0,(AlphaNum *)local_130);
          name_01._M_str = (char *)*plVar24;
          name_01._M_len = plVar24[1];
          pDVar23 = local_c8;
          local_138 = Descriptor::FindFieldByName((Descriptor *)local_c8,name_01);
        }
        if (local_138 == (FieldDescriptor *)0x0) {
          pDVar23 = this->builder_;
          if (pDVar23->pool_->allow_unknown_ != true) {
            if ((pDVar23->undefine_resolved_name_)._M_string_length == 0) {
              local_a0[0]._0_8_ = &local_c0;
              local_130._0_8_ = local_a0;
              local_130._8_8_ =
                   absl::lts_20240722::functional_internal::
                   InvokeObject<google::protobuf::DescriptorBuilder::OptionInterpreter::InterpretSingleOption(google::protobuf::Message*,std::vector<int,std::allocator<int>>const&,std::vector<int,std::allocator<int>>const&,bool)::__3,std::__cxx11::string>
              ;
              make_error_01.invoker_._0_4_ = 0x205b51;
              make_error_01.ptr_.obj = (void *)local_130._0_8_;
              make_error_01.invoker_._4_4_ = 0;
              element_name_01._M_str = (this->options_to_interpret_->element_name)._M_dataplus._M_p;
              element_name_01._M_len = (this->options_to_interpret_->element_name)._M_string_length;
              AddError(pDVar23,element_name_01,&this->uninterpreted_option_->super_Message,
                       OPTION_NAME,make_error_01);
            }
            else {
              local_a0[0]._0_8_ = &local_c0;
              local_130._0_8_ = local_a0;
              local_130._8_8_ =
                   absl::lts_20240722::functional_internal::
                   InvokeObject<google::protobuf::DescriptorBuilder::OptionInterpreter::InterpretSingleOption(google::protobuf::Message*,std::vector<int,std::allocator<int>>const&,std::vector<int,std::allocator<int>>const&,bool)::__2,std::__cxx11::string>
              ;
              make_error_00.invoker_._0_4_ = 0x205a30;
              make_error_00.ptr_.obj = (void *)local_130._0_8_;
              make_error_00.invoker_._4_4_ = 0;
              element_name_00._M_str = (this->options_to_interpret_->element_name)._M_dataplus._M_p;
              element_name_00._M_len = (this->options_to_interpret_->element_name)._M_string_length;
              local_a0[0]._8_8_ = this;
              AddError(pDVar23,element_name_00,&this->uninterpreted_option_->super_Message,
                       OPTION_NAME,make_error_00);
            }
            goto LAB_001f7def;
          }
LAB_001f7b22:
          AddWithoutInterpreting
                    ((OptionInterpreter *)pDVar23,this->uninterpreted_option_,
                     (Message *)local_130._48_8_);
          bVar10 = true;
          bVar6 = false;
        }
        else {
          pDVar5 = (DescriptorBuilder *)local_138->containing_type_;
          if (pDVar5 == local_c8) {
            local_130._0_4_ = local_138->number_;
            if (local_e0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_finish ==
                local_e0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage) {
              std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>
                        (&local_e0,
                         (iterator)
                         local_e0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                         super__Vector_impl_data._M_finish,(int *)local_130);
            }
            else {
              *local_e0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_finish = local_138->number_;
              local_e0.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
              ._M_finish = local_e0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                           super__Vector_impl_data._M_finish + 1;
            }
            if (local_138->file_ == this->builder_->file_) {
              pVVar14 = internal::RepeatedPtrFieldBase::
                        Get<google::protobuf::internal::GenericTypeHandler<google::protobuf::UninterpretedOption_NamePart>>
                                  (&(this->uninterpreted_option_->field_0)._impl_.name_.
                                    super_RepeatedPtrFieldBase,0);
              iVar13 = std::__cxx11::string::compare
                                 ((char *)((ulong)(pVVar14->field_0)._impl_.name_part_.tagged_ptr_.
                                                  ptr_ & 0xfffffffffffffffc));
              if ((iVar13 == 0) &&
                 (pVVar14 = internal::RepeatedPtrFieldBase::
                            Get<google::protobuf::internal::GenericTypeHandler<google::protobuf::UninterpretedOption_NamePart>>
                                      (&(this->uninterpreted_option_->field_0)._impl_.name_.
                                        super_RepeatedPtrFieldBase,0),
                 (pVVar14->field_0)._impl_.is_extension_ == false)) {
                local_a0[0]._0_8_ = &local_c0;
                local_130._0_8_ = local_a0;
                local_130._8_8_ =
                     absl::lts_20240722::functional_internal::
                     InvokeObject<google::protobuf::DescriptorBuilder::OptionInterpreter::InterpretSingleOption(google::protobuf::Message*,std::vector<int,std::allocator<int>>const&,std::vector<int,std::allocator<int>>const&,bool)::__5,std::__cxx11::string>
                ;
                make_error_04.invoker_._0_4_ = 0x205c51;
                make_error_04.ptr_.obj = (void *)local_130._0_8_;
                make_error_04.invoker_._4_4_ = 0;
                element_name_04._M_str =
                     (this->options_to_interpret_->element_name)._M_dataplus._M_p;
                element_name_04._M_len =
                     (this->options_to_interpret_->element_name)._M_string_length;
                AddError(this->builder_,element_name_04,&this->uninterpreted_option_->super_Message,
                         OPTION_NAME,make_error_04);
                goto LAB_001f7def;
              }
            }
            pFVar7 = local_138;
            bVar6 = true;
            if ((this->uninterpreted_option_->field_0)._impl_.name_.super_RepeatedPtrFieldBase.
                current_size_ + -1 <= iVar12) goto LAB_001f7df4;
            if ((local_138->type_ & 0xfe) == 10) {
              bVar20 = local_138->field_0x1;
              bVar8 = (bool)((bVar20 & 0x20) >> 5);
              if (0xbf < bVar20 == bVar8) {
                psVar19 = (string *)0x0;
              }
              else {
                psVar19 = absl::lts_20240722::log_internal::MakeCheckOpString<bool,bool>
                                    (bVar8,0xbf < bVar20,"is_repeated_ == label() == LABEL_REPEATED"
                                    );
              }
              if (psVar19 != (string *)0x0) {
                absl::lts_20240722::log_internal::LogMessageFatal::LogMessageFatal
                          ((LogMessageFatal *)local_130,
                           "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O1/_deps/protobuf-src/src/google/protobuf/descriptor.h"
                           ,0xab7,*(undefined8 *)(psVar19 + 8),*(undefined8 *)psVar19);
                goto LAB_001f839b;
              }
              if ((pFVar7->field_0x1 & 0x20) == 0) {
                if ((undefined1  [8])iStack_f0._M_current == local_e8) {
                  std::
                  vector<google::protobuf::FieldDescriptor_const*,std::allocator<google::protobuf::FieldDescriptor_const*>>
                  ::_M_realloc_insert<google::protobuf::FieldDescriptor_const*const&>
                            ((vector<google::protobuf::FieldDescriptor_const*,std::allocator<google::protobuf::FieldDescriptor_const*>>
                              *)&local_f8,iStack_f0,&local_138);
                }
                else {
                  *iStack_f0._M_current = local_138;
                  iStack_f0._M_current = iStack_f0._M_current + 1;
                }
                local_c8 = (DescriptorBuilder *)FieldDescriptor::message_type(local_138);
                goto LAB_001f7df4;
              }
              local_a0[0]._0_8_ = &local_c0;
              local_130._0_8_ = local_a0;
              local_130._8_8_ =
                   absl::lts_20240722::functional_internal::
                   InvokeObject<google::protobuf::DescriptorBuilder::OptionInterpreter::InterpretSingleOption(google::protobuf::Message*,std::vector<int,std::allocator<int>>const&,std::vector<int,std::allocator<int>>const&,bool)::__7,std::__cxx11::string>
              ;
              make_error_03.invoker_._0_4_ = 0x205d13;
              make_error_03.ptr_.obj = (void *)local_130._0_8_;
              make_error_03.invoker_._4_4_ = 0;
              element_name_03._M_str = (this->options_to_interpret_->element_name)._M_dataplus._M_p;
              element_name_03._M_len = (this->options_to_interpret_->element_name)._M_string_length;
              AddError(this->builder_,element_name_03,&this->uninterpreted_option_->super_Message,
                       OPTION_NAME,make_error_03);
            }
            else {
              local_a0[0]._0_8_ = &local_c0;
              local_130._0_8_ = local_a0;
              local_130._8_8_ =
                   absl::lts_20240722::functional_internal::
                   InvokeObject<google::protobuf::DescriptorBuilder::OptionInterpreter::InterpretSingleOption(google::protobuf::Message*,std::vector<int,std::allocator<int>>const&,std::vector<int,std::allocator<int>>const&,bool)::__6,std::__cxx11::string>
              ;
              make_error_02.invoker_._0_4_ = 0x205cb2;
              make_error_02.ptr_.obj = (void *)local_130._0_8_;
              make_error_02.invoker_._4_4_ = 0;
              element_name_02._M_str = (this->options_to_interpret_->element_name)._M_dataplus._M_p;
              element_name_02._M_len = (this->options_to_interpret_->element_name)._M_string_length;
              AddError(this->builder_,element_name_02,&this->uninterpreted_option_->super_Message,
                       OPTION_NAME,make_error_02);
            }
          }
          else {
            if ((pDVar5 != (DescriptorBuilder *)0x0) && (((ulong)pDVar5->pool_ & 0x100) != 0))
            goto LAB_001f7b22;
            local_a0[0]._0_8_ = &local_c0;
            local_a0[0]._8_8_ = &local_c8;
            local_130._0_8_ = local_a0;
            local_130._8_8_ =
                 absl::lts_20240722::functional_internal::
                 InvokeObject<google::protobuf::DescriptorBuilder::OptionInterpreter::InterpretSingleOption(google::protobuf::Message*,std::vector<int,std::allocator<int>>const&,std::vector<int,std::allocator<int>>const&,bool)::__4,std::__cxx11::string>
            ;
            make_error.invoker_._0_4_ = 0x205bcc;
            make_error.ptr_.obj = (void *)local_130._0_8_;
            make_error.invoker_._4_4_ = 0;
            element_name._M_str = (this->options_to_interpret_->element_name)._M_dataplus._M_p;
            element_name._M_len = (this->options_to_interpret_->element_name)._M_string_length;
            AddError(this->builder_,element_name,&this->uninterpreted_option_->super_Message,
                     OPTION_NAME,make_error);
          }
LAB_001f7def:
          bVar6 = false;
          bVar10 = false;
        }
LAB_001f7df4:
        if (!bVar6) break;
        iVar12 = iVar12 + 1;
        iVar13 = *(int *)((long)&this->uninterpreted_option_->field_0 + 0x10);
        bVar11 = iVar12 < iVar13;
      } while (iVar12 < iVar13);
    }
    if (bVar11) goto LAB_001f8210;
    bVar20 = local_138->field_0x1;
    uVar9 = (bVar20 & 0x20) >> 5;
    options_path = (vector<int,_std::allocator<int>_> *)local_138;
    if (0xbf < bVar20 != (bool)uVar9) goto LAB_001f8288;
    psVar19 = (string *)0x0;
  }
  iVar25._M_current = iStack_f0._M_current;
  intermediate_fields_iter._M_current = local_f8._M_current;
  pFVar7 = local_138;
  if (psVar19 == (string *)0x0) {
    if ((((FieldDescriptor *)options_path)->field_0x1 & 0x20) == 0) {
      MVar26 = Message::GetMetadata((Message *)local_130._48_8_);
      pUVar17 = Reflection::GetUnknownFields(MVar26.reflection,(Message *)local_130._48_8_);
      bVar10 = ExamineIfOptionIsSet
                         (this,intermediate_fields_iter,(const_iterator)iVar25._M_current,pFVar7,
                          &local_c0,pUVar17);
      if (!bVar10) {
        bVar10 = false;
        goto LAB_001f8210;
      }
    }
    local_70.piece_._M_len = (size_t)operator_new(0x10);
    ((FileDescriptor *)local_70.piece_._M_len)->super_SymbolBase = '\0';
    ((FileDescriptor *)local_70.piece_._M_len)->is_placeholder_ = false;
    ((FileDescriptor *)local_70.piece_._M_len)->finished_building_ = false;
    ((FileDescriptor *)local_70.piece_._M_len)->field_0x3 = 0;
    ((FileDescriptor *)local_70.piece_._M_len)->extension_count_ = 0;
    ((FileDescriptor *)local_70.piece_._M_len)->name_ = (string *)0x0;
    bVar10 = SetOptionValue(this,local_138,(UnknownFieldSet *)local_70.piece_._M_len);
    if (bVar10) {
      if (iStack_f0._M_current != local_f8._M_current) {
        iVar25._M_current = iStack_f0._M_current;
        do {
          local_140 = (FileDescriptor *)operator_new(0x10);
          local_140->super_SymbolBase = '\0';
          local_140->is_placeholder_ = false;
          local_140->finished_building_ = false;
          local_140->field_0x3 = 0;
          local_140->extension_count_ = 0;
          local_140->name_ = (string *)0x0;
          ppFVar1 = iVar25._M_current + -1;
          uVar2 = iVar25._M_current[-1]->type_;
          if (uVar2 == '\n') {
            pUVar17 = UnknownFieldSet::AddGroup
                                ((UnknownFieldSet *)local_140,iVar25._M_current[-1]->number_);
            UnknownFieldSet::MergeFrom(pUVar17,(UnknownFieldSet *)local_70.piece_._M_len);
          }
          else {
            if (uVar2 != '\v') {
              absl::lts_20240722::log_internal::LogMessageFatal::LogMessageFatal
                        ((LogMessageFatal *)local_130,
                         "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O1/_deps/protobuf-src/src/google/protobuf/descriptor.cc"
                         ,0x22e8);
              absl::lts_20240722::log_internal::LogMessage::
              CopyToEncodedBuffer<(absl::lts_20240722::log_internal::LogMessage::StringType)0>
                        (local_130,0x27,"Invalid wire type for CPPTYPE_MESSAGE: ");
              local_34 = (Type)iVar25._M_current[-1]->type_;
              absl::lts_20240722::log_internal::LogMessage::
              operator<<<google::protobuf::internal::FieldDescriptorLite::Type,_0>
                        ((LogMessage *)local_130,&local_34);
              goto LAB_001f839b;
            }
            local_130._8_8_ = (slot_type *)0x0;
            local_130[0x10] = '\0';
            local_130._0_8_ = (HeapOrSoo *)(local_130 + 0x10);
            bVar11 = UnknownFieldSet::SerializeToString
                               ((UnknownFieldSet *)local_70.piece_._M_len,(string *)local_130);
            if (!bVar11) {
              absl::lts_20240722::log_internal::LogMessageFatal::LogMessageFatal
                        ((LogMessageFatal *)local_a0,
                         "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O1/_deps/protobuf-src/src/google/protobuf/descriptor.cc"
                         ,0x22d9,0x2a,"unknown_fields->SerializeToString(&outstr)");
              absl::lts_20240722::log_internal::LogMessage::
              CopyToEncodedBuffer<(absl::lts_20240722::log_internal::LogMessage::StringType)0>
                        (local_a0,0x37,"Unexpected failure while serializing option submessage ");
              uVar18 = absl::lts_20240722::log_internal::LogMessage::operator<<
                                 ((LogMessage *)&local_a0[0].heap,(string *)&local_c0);
              absl::lts_20240722::log_internal::LogMessage::
              CopyToEncodedBuffer<(absl::lts_20240722::log_internal::LogMessage::StringType)0>
                        (uVar18,2,"\".");
              if (!bVar11) {
                absl::lts_20240722::log_internal::LogMessageFatal::~LogMessageFatal
                          ((LogMessageFatal *)&local_a0[0].heap);
              }
            }
            UnknownFieldSet::AddLengthDelimited<>
                      ((UnknownFieldSet *)local_140,(*ppFVar1)->number_,(string *)local_130);
            if ((HeapOrSoo *)local_130._0_8_ != (HeapOrSoo *)(local_130 + 0x10)) {
              operator_delete((void *)local_130._0_8_,CONCAT71(local_130._17_7_,local_130[0x10]) + 1
                             );
            }
          }
          __ptr = local_70.piece_._M_len;
          local_70.piece_._M_len = (size_t)local_140;
          local_140 = (FileDescriptor *)0x0;
          if ((FileDescriptor *)__ptr != (FileDescriptor *)0x0) {
            std::default_delete<google::protobuf::UnknownFieldSet>::operator()
                      ((default_delete<google::protobuf::UnknownFieldSet> *)&local_70,
                       (UnknownFieldSet *)__ptr);
          }
          if (local_140 != (FileDescriptor *)0x0) {
            std::default_delete<google::protobuf::UnknownFieldSet>::operator()
                      ((default_delete<google::protobuf::UnknownFieldSet> *)&local_140,
                       (UnknownFieldSet *)local_140);
          }
          iVar25._M_current = ppFVar1;
        } while (ppFVar1 != local_f8._M_current);
      }
      MVar26 = Message::GetMetadata((Message *)local_130._48_8_);
      pUVar17 = Reflection::MutableUnknownFields(MVar26.reflection,(Message *)local_130._48_8_);
      UnknownFieldSet::MergeFrom(pUVar17,(UnknownFieldSet *)local_70.piece_._M_len);
      pFVar7 = local_138;
      bVar20 = local_138->field_0x1;
      bVar11 = (bool)((bVar20 & 0x20) >> 5);
      if (0xbf < bVar20 == bVar11) {
        psVar19 = (string *)0x0;
      }
      else {
        psVar19 = absl::lts_20240722::log_internal::MakeCheckOpString<bool,bool>
                            (bVar11,0xbf < bVar20,"is_repeated_ == label() == LABEL_REPEATED");
      }
      if (psVar19 != (string *)0x0) {
        absl::lts_20240722::log_internal::LogMessageFatal::LogMessageFatal
                  ((LogMessageFatal *)local_130,
                   "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O1/_deps/protobuf-src/src/google/protobuf/descriptor.h"
                   ,0xab7,*(undefined8 *)(psVar19 + 8),*(undefined8 *)psVar19);
        goto LAB_001f839b;
      }
      if ((pFVar7->field_0x1 & 0x20) != 0) {
        absl::lts_20240722::container_internal::
        raw_hash_map<absl::lts_20240722::container_internal::FlatHashMapPolicy<std::vector<int,std::allocator<int>>,int>,absl::lts_20240722::hash_internal::Hash<std::vector<int,std::allocator<int>>>,std::equal_to<std::vector<int,std::allocator<int>>>,std::allocator<std::pair<std::vector<int,std::allocator<int>>const,int>>>
        ::try_emplace_impl<std::vector<int,std::allocator<int>>const&>
                  ((pair<absl::lts_20240722::container_internal::raw_hash_set<absl::lts_20240722::container_internal::FlatHashMapPolicy<std::vector<int,_std::allocator<int>_>,_int>,_absl::lts_20240722::hash_internal::Hash<std::vector<int,_std::allocator<int>_>_>,_std::equal_to<std::vector<int,_std::allocator<int>_>_>,_std::allocator<std::pair<const_std::vector<int,_std::allocator<int>_>,_int>_>_>::iterator,_bool>
                    *)local_130,&this->repeated_option_counts_,&local_e0);
        iVar12 = *(int *)(local_130._8_8_ + 0x18);
        *(int *)(local_130._8_8_ + 0x18) = iVar12 + 1;
        local_140 = (FileDescriptor *)CONCAT44(local_140._4_4_,iVar12);
        if (local_e0.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
            _M_finish ==
            local_e0.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
            _M_end_of_storage) {
          std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                    ((vector<int,std::allocator<int>> *)&local_e0,
                     (iterator)
                     local_e0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_finish,(int *)&local_140);
        }
        else {
          *local_e0.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
           _M_finish = iVar12;
          local_e0.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_finish = local_e0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_finish + 1;
        }
      }
      absl::lts_20240722::container_internal::
      raw_hash_map<absl::lts_20240722::container_internal::FlatHashMapPolicy<std::vector<int,std::allocator<int>>,std::vector<int,std::allocator<int>>>,absl::lts_20240722::hash_internal::Hash<std::vector<int,std::allocator<int>>>,std::equal_to<std::vector<int,std::allocator<int>>>,std::allocator<std::pair<std::vector<int,std::allocator<int>>const,std::vector<int,std::allocator<int>>>>>
      ::try_emplace_impl<std::vector<int,std::allocator<int>>const&>
                ((pair<absl::lts_20240722::container_internal::raw_hash_set<absl::lts_20240722::container_internal::FlatHashMapPolicy<std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>_>,_absl::lts_20240722::hash_internal::Hash<std::vector<int,_std::allocator<int>_>_>,_std::equal_to<std::vector<int,_std::allocator<int>_>_>,_std::allocator<std::pair<const_std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>_>_>_>::iterator,_bool>
                  *)local_130,&this->interpreted_paths_,local_40);
      std::vector<int,_std::allocator<int>_>::operator=
                ((vector<int,_std::allocator<int>_> *)(local_130._8_8_ + 0x18),&local_e0);
    }
    if ((FileDescriptor *)local_70.piece_._M_len != (FileDescriptor *)0x0) {
      std::default_delete<google::protobuf::UnknownFieldSet>::operator()
                ((default_delete<google::protobuf::UnknownFieldSet> *)&local_70,
                 (UnknownFieldSet *)local_70.piece_._M_len);
    }
LAB_001f8210:
    if (local_e0.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_start != (pointer)0x0) {
      operator_delete(local_e0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)local_e0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage -
                      (long)local_e0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_start);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_c0._M_dataplus._M_p != &local_c0.field_2) {
      operator_delete(local_c0._M_dataplus._M_p,
                      CONCAT71(local_c0.field_2._M_allocated_capacity._1_7_,
                               local_c0.field_2._M_local_buf[0]) + 1);
    }
    if (local_f8._M_current == (FieldDescriptor **)0x0) {
      return bVar10;
    }
    operator_delete(local_f8._M_current,(long)local_e8 - (long)local_f8._M_current);
    return bVar10;
  }
  absl::lts_20240722::log_internal::LogMessageFatal::LogMessageFatal
            ((LogMessageFatal *)local_130,
             "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O1/_deps/protobuf-src/src/google/protobuf/descriptor.h"
             ,0xab7,*(undefined8 *)(psVar19 + 8),*(undefined8 *)psVar19);
LAB_001f839b:
  absl::lts_20240722::log_internal::LogMessageFatal::~LogMessageFatal((LogMessageFatal *)local_130);
}

Assistant:

bool DescriptorBuilder::OptionInterpreter::InterpretSingleOption(
    Message* options, const std::vector<int>& src_path,
    const std::vector<int>& options_path, bool skip_extensions) {
  // First do some basic validation.
  if (uninterpreted_option_->name_size() == 0) {
    // This should never happen unless the parser has gone seriously awry or
    // someone has manually created the uninterpreted option badly.
    if (skip_extensions) {
      // Come back to it later.
      return true;
    }
    return AddNameError(
        []() -> std::string { return "Option must have a name."; });
  }
  if (uninterpreted_option_->name(0).name_part() == "uninterpreted_option") {
    if (skip_extensions) {
      // Come back to it later.
      return true;
    }
    return AddNameError([]() -> std::string {
      return "Option must not use reserved name \"uninterpreted_option\".";
    });
  }

  if (skip_extensions == uninterpreted_option_->name(0).is_extension()) {
    // Allow feature and option interpretation to occur in two phases.  This is
    // necessary because features *are* options and need to be interpreted
    // before resolving them.  However, options can also *have* features
    // attached to them.
    return true;
  }

  const Descriptor* options_descriptor = nullptr;
  // Get the options message's descriptor from the builder's pool, so that we
  // get the version that knows about any extension options declared in the file
  // we're currently building. The descriptor should be there as long as the
  // file we're building imported descriptor.proto.

  // Note that we use DescriptorBuilder::FindSymbolNotEnforcingDeps(), not
  // DescriptorPool::FindMessageTypeByName() because we're already holding the
  // pool's mutex, and the latter method locks it again.  We don't use
  // FindSymbol() because files that use custom options only need to depend on
  // the file that defines the option, not descriptor.proto itself.
  Symbol symbol = builder_->FindSymbolNotEnforcingDeps(
      options->GetDescriptor()->full_name());
  options_descriptor = symbol.descriptor();
  if (options_descriptor == nullptr) {
    // The options message's descriptor was not in the builder's pool, so use
    // the standard version from the generated pool. We're not holding the
    // generated pool's mutex, so we can search it the straightforward way.
    options_descriptor = options->GetDescriptor();
  }
  ABSL_CHECK(options_descriptor);

  // We iterate over the name parts to drill into the submessages until we find
  // the leaf field for the option. As we drill down we remember the current
  // submessage's descriptor in |descriptor| and the next field in that
  // submessage in |field|. We also track the fields we're drilling down
  // through in |intermediate_fields|. As we go, we reconstruct the full option
  // name in |debug_msg_name|, for use in error messages.
  const Descriptor* descriptor = options_descriptor;
  const FieldDescriptor* field = nullptr;
  std::vector<const FieldDescriptor*> intermediate_fields;
  std::string debug_msg_name = "";

  std::vector<int> dest_path = options_path;

  for (int i = 0; i < uninterpreted_option_->name_size(); ++i) {
    builder_->undefine_resolved_name_.clear();
    const std::string& name_part = uninterpreted_option_->name(i).name_part();
    if (!debug_msg_name.empty()) {
      absl::StrAppend(&debug_msg_name, ".");
    }
    if (uninterpreted_option_->name(i).is_extension()) {
      absl::StrAppend(&debug_msg_name, "(", name_part, ")");
      // Search for the extension's descriptor as an extension in the builder's
      // pool. Note that we use DescriptorBuilder::LookupSymbol(), not
      // DescriptorPool::FindExtensionByName(), for two reasons: 1) It allows
      // relative lookups, and 2) because we're already holding the pool's
      // mutex, and the latter method locks it again.
      symbol =
          builder_->LookupSymbol(name_part, options_to_interpret_->name_scope);
      field = symbol.field_descriptor();
      // If we don't find the field then the field's descriptor was not in the
      // builder's pool, but there's no point in looking in the generated
      // pool. We require that you import the file that defines any extensions
      // you use, so they must be present in the builder's pool.
    } else {
      absl::StrAppend(&debug_msg_name, name_part);
      // Search for the field's descriptor as a regular field.
      field = descriptor->FindFieldByName(name_part);
    }

    if (field == nullptr) {
      if (get_allow_unknown(builder_->pool_)) {
        // We can't find the option, but AllowUnknownDependencies() is enabled,
        // so we will just leave it as uninterpreted.
        AddWithoutInterpreting(*uninterpreted_option_, options);
        return true;
      } else if (!(builder_->undefine_resolved_name_).empty()) {
        // Option is resolved to a name which is not defined.
        return AddNameError([&] {
          return absl::StrCat(
              "Option \"", debug_msg_name, "\" is resolved to \"(",
              builder_->undefine_resolved_name_,
              ")\", which is not defined. The innermost scope is searched "
              "first "
              "in name resolution. Consider using a leading '.'(i.e., \"(.",
              debug_msg_name.substr(1),
              "\") to start from the outermost scope.");
        });
      } else {
        return AddNameError([&] {
          return absl::StrCat(
              "Option \"", debug_msg_name, "\" unknown. Ensure that your proto",
              " definition file imports the proto which defines the option.");
        });
      }
    } else if (field->containing_type() != descriptor) {
      if (get_is_placeholder(field->containing_type())) {
        // The field is an extension of a placeholder type, so we can't
        // reliably verify whether it is a valid extension to use here (e.g.
        // we don't know if it is an extension of the correct *Options message,
        // or if it has a valid field number, etc.).  Just leave it as
        // uninterpreted instead.
        AddWithoutInterpreting(*uninterpreted_option_, options);
        return true;
      } else {
        // This can only happen if, due to some insane misconfiguration of the
        // pools, we find the options message in one pool but the field in
        // another. This would probably imply a hefty bug somewhere.
        return AddNameError([&] {
          return absl::StrCat("Option field \"", debug_msg_name,
                              "\" is not a field or extension of message \"",
                              descriptor->name(), "\".");
        });
      }
    } else {
      // accumulate field numbers to form path to interpreted option
      dest_path.push_back(field->number());

      // Special handling to prevent feature use in the same file as the
      // definition.
      // TODO Add proper support for cases where this can work.
      if (field->file() == builder_->file_ &&
          uninterpreted_option_->name(0).name_part() == "features" &&
          !uninterpreted_option_->name(0).is_extension()) {
        return AddNameError([&] {
          return absl::StrCat(
              "Feature \"", debug_msg_name,
              "\" can't be used in the same file it's defined in.");
        });
      }

      if (i < uninterpreted_option_->name_size() - 1) {
        if (field->cpp_type() != FieldDescriptor::CPPTYPE_MESSAGE) {
          return AddNameError([&] {
            return absl::StrCat("Option \"", debug_msg_name,
                                "\" is an atomic type, not a message.");
          });
        } else if (field->is_repeated()) {
          return AddNameError([&] {
            return absl::StrCat("Option field \"", debug_msg_name,
                                "\" is a repeated message. Repeated message "
                                "options must be initialized using an "
                                "aggregate value.");
          });
        } else {
          // Drill down into the submessage.
          intermediate_fields.push_back(field);
          descriptor = field->message_type();
        }
      }
    }
  }

  // We've found the leaf field. Now we use UnknownFieldSets to set its value
  // on the options message. We do so because the message may not yet know
  // about its extension fields, so we may not be able to set the fields
  // directly. But the UnknownFieldSets will serialize to the same wire-format
  // message, so reading that message back in once the extension fields are
  // known will populate them correctly.

  // First see if the option is already set.
  if (!field->is_repeated() &&
      !ExamineIfOptionIsSet(
          intermediate_fields.begin(), intermediate_fields.end(), field,
          debug_msg_name,
          options->GetReflection()->GetUnknownFields(*options))) {
    return false;  // ExamineIfOptionIsSet() already added the error.
  }

  // First set the value on the UnknownFieldSet corresponding to the
  // innermost message.
  std::unique_ptr<UnknownFieldSet> unknown_fields(new UnknownFieldSet());
  if (!SetOptionValue(field, unknown_fields.get())) {
    return false;  // SetOptionValue() already added the error.
  }

  // Now wrap the UnknownFieldSet with UnknownFieldSets corresponding to all
  // the intermediate messages.
  for (std::vector<const FieldDescriptor*>::reverse_iterator iter =
           intermediate_fields.rbegin();
       iter != intermediate_fields.rend(); ++iter) {
    std::unique_ptr<UnknownFieldSet> parent_unknown_fields(
        new UnknownFieldSet());
    switch ((*iter)->type()) {
      case FieldDescriptor::TYPE_MESSAGE: {
        std::string outstr;
        ABSL_CHECK(unknown_fields->SerializeToString(&outstr))
            << "Unexpected failure while serializing option submessage "
            << debug_msg_name << "\".";
        parent_unknown_fields->AddLengthDelimited((*iter)->number(),
                                                  std::move(outstr));
        break;
      }

      case FieldDescriptor::TYPE_GROUP: {
        parent_unknown_fields->AddGroup((*iter)->number())
            ->MergeFrom(*unknown_fields);
        break;
      }

      default:
        ABSL_LOG(FATAL) << "Invalid wire type for CPPTYPE_MESSAGE: "
                        << (*iter)->type();
        return false;
    }
    unknown_fields = std::move(parent_unknown_fields);
  }

  // Now merge the UnknownFieldSet corresponding to the top-level message into
  // the options message.
  options->GetReflection()->MutableUnknownFields(options)->MergeFrom(
      *unknown_fields);

  // record the element path of the interpreted option
  if (field->is_repeated()) {
    int index = repeated_option_counts_[dest_path]++;
    dest_path.push_back(index);
  }
  interpreted_paths_[src_path] = dest_path;

  return true;
}